

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_relay.cpp
# Opt level: O2

bool __thiscall UDPRelay::Init(UDPRelay *this)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  sockaddr_in service;
  
  iVar2 = socket(2,2,0x11);
  this->server_socket_ = iVar2;
  if (iVar2 == -1) {
    bVar3 = false;
  }
  else {
    service.sin_family = 2;
    inet_pton(2,(this->listen_addr_)._M_dataplus._M_p,&service.sin_addr);
    uVar1 = (ushort)this->listen_port_;
    service.sin_port = uVar1 << 8 | uVar1 >> 8;
    iVar2 = bind(this->server_socket_,(sockaddr *)&service,0x10);
    bVar3 = iVar2 == 0;
    if (bVar3) {
      SetNoBlocking(this->server_socket_);
    }
  }
  return bVar3;
}

Assistant:

bool UDPRelay::Init()
{
    server_socket_ = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
    if (server_socket_ == INVALID_SOCKET)
        return false;
    struct sockaddr_in service;
    service.sin_family = AF_INET;
    inet_pton(AF_INET, listen_addr_.c_str(), &service.sin_addr.s_addr);
    service.sin_port = htons(listen_port_);

    if (0 != bind(server_socket_, (sockaddr *)&service,
                  sizeof(service)))
    {
        return false;
    }
    SetNoBlocking(server_socket_);
    return true;
}